

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O2

word zzAdd3(word *c,word *a,size_t n,word *b,size_t m)

{
  word wVar1;
  size_t n_00;
  word *b_00;
  
  n_00 = n - m;
  if (n < m || n_00 == 0) {
    if (n >= m) {
      wVar1 = zzAdd(c,a,b,n);
      return wVar1;
    }
    b_00 = c + n;
    n_00 = m - n;
    wwCopy(b_00,b + n,n_00);
    wVar1 = zzAdd(c,a,b,n);
  }
  else {
    b_00 = c + m;
    wwCopy(b_00,a + m,n_00);
    wVar1 = zzAdd(c,a,b,m);
  }
  wVar1 = zzAddW2(b_00,n_00,wVar1);
  return wVar1;
}

Assistant:

word zzAdd3(word c[], const word a[], size_t n, const word b[], size_t m)
{
	if (n > m)
	{
		wwCopy(c + m, a + m, n - m);
		return zzAddW2(c + m, n - m, zzAdd(c, a, b, m));
	}
	if (n < m)
	{
		wwCopy(c + n, b + n, m - n);
		return zzAddW2(c + n, m - n, zzAdd(c, a, b, n));
	}
	return zzAdd(c, a, b, n);
}